

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

void __thiscall pg::PSISolver::compute_vals_seq(PSISolver *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  reference pvVar6;
  int local_50;
  int local_4c;
  int from;
  int s_1;
  int *val_v;
  int v;
  int s;
  int n;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> q;
  PSISolver *this_local;
  
  q.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  pvVar1 = first_in;
  lVar4 = Solver::nodecount(&this->super_Solver);
  memset(pvVar1,0xff,lVar4 << 2);
  for (v = 0; lVar4 = (long)v, lVar5 = Solver::nodecount(&this->super_Solver), lVar4 < lVar5;
      v = v + 1) {
    if (*(int *)(done + (long)v * 4) != 3) {
      val_v._4_4_ = *(int *)(str + (long)v * 4);
      if ((val_v._4_4_ == -1) || (*(int *)(halt + (long)val_v._4_4_ * 4) != 0)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_28,&v);
      }
      else {
        *(undefined4 *)(next_in + (long)v * 4) =
             *(undefined4 *)((long)first_in + (long)val_v._4_4_ * 4);
        *(int *)((long)first_in + (long)val_v._4_4_ * 4) = v;
        if (*(int *)(done + (long)v * 4) != 2) {
          *(undefined4 *)(done + (long)v * 4) = 2;
        }
      }
    }
  }
  while (bVar2 = std::vector<int,_std::allocator<int>_>::empty
                           ((vector<int,_std::allocator<int>_> *)local_28),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)local_28);
    val_v._0_4_ = *pvVar6;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)local_28);
    _from = (void *)(val + (long)(int)(pg::k * (value_type)val_v) * 4);
    local_4c = *(int *)(str + (long)(value_type)val_v * 4);
    if ((local_4c == -1) || (*(int *)(halt + (long)local_4c * 4) != 0)) {
      memset(_from,0,(ulong)pg::k << 2);
    }
    else {
      memcpy(_from,(void *)(val + (long)(int)(pg::k * local_4c) * 4),(ulong)pg::k << 2);
    }
    pvVar1 = _from;
    iVar3 = Solver::priority(&this->super_Solver,(value_type)val_v);
    *(int *)((long)pvVar1 + (long)iVar3 * 4) = *(int *)((long)pvVar1 + (long)iVar3 * 4) + 1;
    *(undefined4 *)(done + (long)(value_type)val_v * 4) = 1;
    for (local_50 = *(int *)((long)first_in + (long)(value_type)val_v * 4); local_50 != -1;
        local_50 = *(int *)(next_in + (long)local_50 * 4)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_28,&local_50);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void
PSISolver::compute_vals_seq(void)
{
    std::vector<int> q;

    memset(first_in, -1, sizeof(int[nodecount()]));

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // disabled
        int s = str[n];
        if (s == -1 or halt[s]) { // either we halt or the dummy halts...
            // assuming that valuation is properly initialized...
            q.push_back(n);
        } else {
            next_in[n] = first_in[s];
            first_in[s] = n;
            if (done[n] != 2) done[n] = 2; // mark "2", if not updated, then it's on a cycle
        }
    }

    while (!q.empty()) {
        int v = q.back();
        q.pop_back();

        // set valuation
        int *val_v = val + k*v;
        int s = str[v];
        if (s == -1 or halt[s]) memset(val_v, 0, sizeof(int[k]));
        else memcpy(val_v, val+k*s, sizeof(int[k]));
        val_v[priority(v)]++;
        done[v] = 1; // mark "1" as processed and not on a cycle

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            q.push_back(from);
            from = next_in[from];
        }
    }
}